

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O2

word extract_bits(word in,word mask)

{
  word res;
  word wVar1;
  word bb;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = 1;
  wVar1 = 0;
  for (; mask != 0; mask = mask - 1 & mask) {
    uVar3 = -mask & mask & in;
    if (uVar3 != 0) {
      uVar3 = uVar2;
    }
    uVar2 = uVar2 * 2;
    wVar1 = wVar1 | uVar3;
  }
  return wVar1;
}

Assistant:

static word extract_bits(word in, word mask) {
  word res = 0;
  for (word bb = 1; mask != 0; bb <<= 1, mask &= (mask - 1)) {
    res |= bb & (-((word) !!(in & mask & -mask)));
  }
  return res;
}